

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

arena_s * arena_lock(arena_s *preffered)

{
  int iVar1;
  ulong local_28;
  size_t i;
  arena_s *arena;
  arena_s *preffered_local;
  
  arena = preffered;
  if (preffered == (arena_s *)0x0) {
    arena = arenas;
  }
  iVar1 = fio_trylock(&arena->lock);
  if (iVar1 == 0) {
    return arena;
  }
  do {
    i = (size_t)arena;
    for (local_28 = (long)arena - (long)arenas >> 4; local_28 < memory.cores;
        local_28 = local_28 + 1) {
      if (((arena == arenas) || ((arena_s *)i != arena)) &&
         (iVar1 = fio_trylock((fio_lock_i *)(i + 8)), iVar1 == 0)) {
        return (arena_s *)i;
      }
      i = i + 0x10;
    }
    if (arena == arenas) {
      fio_reschedule_thread();
    }
    arena = arenas;
  } while( true );
}

Assistant:

static inline arena_s *arena_lock(arena_s *preffered) {
  if (!preffered)
    preffered = arenas;
  if (!fio_trylock(&preffered->lock))
    return preffered;
  do {
    arena_s *arena = preffered;
    for (size_t i = (size_t)(arena - arenas); i < memory.cores; ++i) {
      if ((preffered == arenas || arena != preffered) &&
          !fio_trylock(&arena->lock))
        return arena;
      ++arena;
    }
    if (preffered == arenas)
      fio_reschedule_thread();
    preffered = arenas;
  } while (1);
}